

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O2

Error asmjit::EmitterUtils::logInstructionFailed
                (BaseAssembler *self,Error err,uint32_t instId,uint32_t options,Operand_ *o0,
                Operand_ *o1,Operand_ *o2,Operand_ *opExt)

{
  Error EVar1;
  char *str;
  undefined8 message;
  BaseInst local_1d8;
  StringTmp<256UL> sb;
  Operand_ opArray [6];
  
  sb.super_String.field_0._large.data = sb._embeddedData;
  sb.super_String.field_0._large.size = 0;
  sb.super_String.field_0._0_8_ = 0x20;
  sb.super_String.field_0._large.capacity = 0x107;
  sb._embeddedData[0] = '\0';
  str = DebugUtils::errorAsString(err);
  String::append(&sb.super_String,str,0xffffffffffffffff);
  String::append(&sb.super_String,": ",0xffffffffffffffff);
  opArray[0]._signature = o0->_signature;
  opArray[0]._baseId = o0->_baseId;
  opArray[0]._data = *&o0->_data;
  opArray[1]._signature = o1->_signature;
  opArray[1]._baseId = o1->_baseId;
  opArray[1]._data = *&o1->_data;
  opArray[2]._signature = o2->_signature;
  opArray[2]._baseId = o2->_baseId;
  opArray[2]._data = *&o2->_data;
  opArray[3]._signature = opExt->_signature;
  opArray[3]._baseId = opExt->_baseId;
  opArray[3]._data = *&opExt->_data;
  opArray[4]._signature = opExt[1]._signature;
  opArray[4]._baseId = opExt[1]._baseId;
  opArray[4]._data = *&opExt[1]._data;
  opArray[5]._signature = opExt[2]._signature;
  opArray[5]._baseId = opExt[2]._baseId;
  opArray[5]._data = *&opExt[2]._data;
  local_1d8._extraReg = (self->super_BaseEmitter)._extraReg;
  local_1d8._id = instId;
  local_1d8._options = options;
  Formatter::formatInstruction
            (&sb.super_String,0,&self->super_BaseEmitter,
             (uint)(self->super_BaseEmitter)._environment._arch,&local_1d8,opArray,6);
  if ((self->super_BaseEmitter)._inlineComment != (char *)0x0) {
    String::append(&sb.super_String," ; ",0xffffffffffffffff);
    String::append(&sb.super_String,(self->super_BaseEmitter)._inlineComment,0xffffffffffffffff);
  }
  *(undefined4 *)((long)&(self->super_BaseEmitter)._inlineComment + 4) = 0;
  (self->super_BaseEmitter)._instOptions = 0;
  (self->super_BaseEmitter)._extraReg._signature = 0;
  *(undefined8 *)&(self->super_BaseEmitter)._extraReg._id = 0;
  message = sb.super_String.field_0._large.data;
  if (sb.super_String.field_0._type < 0x1f) {
    message = sb.super_String.field_0._small.data;
  }
  EVar1 = BaseEmitter::reportError(&self->super_BaseEmitter,err,(char *)message);
  String::reset(&sb.super_String);
  return EVar1;
}

Assistant:

Error logInstructionFailed(
  BaseAssembler* self,
  Error err,
  uint32_t instId, uint32_t options, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_* opExt) {

  StringTmp<256> sb;
  sb.append(DebugUtils::errorAsString(err));
  sb.append(": ");

  Operand_ opArray[Globals::kMaxOpCount];
  EmitterUtils::opArrayFromEmitArgs(opArray, o0, o1, o2, opExt);

  Formatter::formatInstruction(sb, 0, self, self->arch(), BaseInst(instId, options, self->extraReg()), opArray, Globals::kMaxOpCount);

  if (self->inlineComment()) {
    sb.append(" ; ");
    sb.append(self->inlineComment());
  }

  self->resetInstOptions();
  self->resetExtraReg();
  self->resetInlineComment();
  return self->reportError(err, sb.data());
}